

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

wchar_t archive_read_format_zip_options(archive_read *a,char *key,char *val)

{
  int iVar1;
  archive_string_conv *paVar2;
  archive *in_RDX;
  char *in_RSI;
  archive *in_RDI;
  wchar_t ret;
  zip *zip;
  bool local_2d;
  char *charset;
  wchar_t local_4;
  
  local_4 = L'\xffffffe7';
  charset = *(char **)in_RDI[0x15].archive_format_name;
  iVar1 = strcmp(in_RSI,"compat-2x");
  if (iVar1 == 0) {
    *(uint *)(charset + 0x168) = (uint)(in_RDX != (archive *)0x0);
    local_4 = L'\0';
  }
  else {
    iVar1 = strcmp(in_RSI,"hdrcharset");
    if (iVar1 == 0) {
      if ((in_RDX == (archive *)0x0) || ((char)in_RDX->magic == '\0')) {
        archive_set_error(in_RDI,-1,"zip: hdrcharset option needs a character-set name");
      }
      else {
        paVar2 = archive_string_conversion_from_charset(in_RDX,charset,local_4);
        *(archive_string_conv **)(charset + 0x150) = paVar2;
        if (*(long *)(charset + 0x150) == 0) {
          local_4 = L'\xffffffe2';
        }
        else {
          iVar1 = strcmp((char *)in_RDX,"UTF-8");
          if (iVar1 == 0) {
            *(undefined8 *)(charset + 0x160) = *(undefined8 *)(charset + 0x150);
          }
          local_4 = L'\0';
        }
      }
    }
    else {
      iVar1 = strcmp(in_RSI,"ignorecrc32");
      if (iVar1 == 0) {
        if ((in_RDX == (archive *)0x0) || ((char)in_RDX->magic == '\0')) {
          *(code **)(charset + 0xb8) = real_crc32;
          charset[0xc0] = '\0';
        }
        else {
          *(code **)(charset + 0xb8) = fake_crc32;
          charset[0xc0] = '\x01';
        }
        local_4 = L'\0';
      }
      else {
        iVar1 = strcmp(in_RSI,"mac-ext");
        if (iVar1 == 0) {
          local_2d = false;
          if (in_RDX != (archive *)0x0) {
            local_2d = (char)in_RDX->magic != '\0';
          }
          *(uint *)(charset + 0x16c) = (uint)local_2d;
          local_4 = L'\0';
        }
        else {
          local_4 = L'\xffffffec';
        }
      }
    }
  }
  return local_4;
}

Assistant:

static int
archive_read_format_zip_options(struct archive_read *a,
    const char *key, const char *val)
{
	struct zip *zip;
	int ret = ARCHIVE_FAILED;

	zip = (struct zip *)(a->format->data);
	if (strcmp(key, "compat-2x")  == 0) {
		/* Handle filenames as libarchive 2.x */
		zip->init_default_conversion = (val != NULL) ? 1 : 0;
		return (ARCHIVE_OK);
	} else if (strcmp(key, "hdrcharset")  == 0) {
		if (val == NULL || val[0] == 0)
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "zip: hdrcharset option needs a character-set name"
			);
		else {
			zip->sconv = archive_string_conversion_from_charset(
			    &a->archive, val, 0);
			if (zip->sconv != NULL) {
				if (strcmp(val, "UTF-8") == 0)
					zip->sconv_utf8 = zip->sconv;
				ret = ARCHIVE_OK;
			} else
				ret = ARCHIVE_FATAL;
		}
		return (ret);
	} else if (strcmp(key, "ignorecrc32") == 0) {
		/* Mostly useful for testing. */
		if (val == NULL || val[0] == 0) {
			zip->crc32func = real_crc32;
			zip->ignore_crc32 = 0;
		} else {
			zip->crc32func = fake_crc32;
			zip->ignore_crc32 = 1;
		}
		return (ARCHIVE_OK);
	} else if (strcmp(key, "mac-ext") == 0) {
		zip->process_mac_extensions = (val != NULL && val[0] != 0);
		return (ARCHIVE_OK);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}